

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool __thiscall re2::PCRE::CheckRewriteString(PCRE *this,StringPiece *rewrite,string *error)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int n;
  int c;
  char *end;
  char *s;
  int max_token;
  string *error_local;
  StringPiece *rewrite_local;
  PCRE *this_local;
  
  s._4_4_ = 0xffffffff;
  end = StringPiece::data(rewrite);
  iVar1 = StringPiece::size(rewrite);
  pcVar4 = end + iVar1;
  do {
    if (pcVar4 <= end) {
      iVar1 = NumberOfCapturingGroups(this);
      if ((int)s._4_4_ > iVar1) {
        uVar3 = NumberOfCapturingGroups(this);
        SStringPrintf(error,
                      "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                      ,(ulong)s._4_4_,(ulong)uVar3);
      }
      return (int)s._4_4_ <= iVar1;
    }
    if (*end == '\\') {
      end = end + 1;
      if (end == pcVar4) {
        std::__cxx11::string::operator=
                  ((string *)error,"Rewrite schema error: \'\\\' not allowed at end.");
        return false;
      }
      iVar1 = (int)*end;
      if (iVar1 != 0x5c) {
        iVar2 = isdigit(iVar1);
        if (iVar2 == 0) {
          std::__cxx11::string::operator=
                    ((string *)error,
                     "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.");
          return false;
        }
        if ((int)s._4_4_ < (int)(iVar1 - 0x30U)) {
          s._4_4_ = iVar1 - 0x30U;
        }
      }
    }
    end = end + 1;
  } while( true );
}

Assistant:

bool PCRE::CheckRewriteString(const StringPiece& rewrite, string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    SStringPrintf(error, "Rewrite schema requests %d matches, "
                  "but the regexp only has %d parenthesized subexpressions.",
                  max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}